

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O1

void on_underlying_io_bytes_received(void *context,uchar *buffer,size_t size)

{
  SSL *ssl;
  int iVar1;
  LOGGER_LOG p_Var2;
  uchar buffer_1 [64];
  undefined1 auStack_78 [72];
  
  iVar1 = BIO_write(*(BIO **)((long)context + 0x58),buffer,(int)size);
  if (iVar1 != (int)size) {
    *(undefined4 *)((long)context + 0x68) = 6;
    indicate_error((TLS_IO_INSTANCE *)context);
    log_ERR_get_error("Error in BIO_write.");
    return;
  }
  if (*(int *)((long)context + 0x68) == 4) {
    do {
      ssl = *(SSL **)((long)context + 0x48);
      if (ssl == (SSL *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                    ,"decode_ssl_received_bytes",0x380,1,
                    "SSL channel closed in decode_ssl_received_bytes.");
        }
        break;
      }
      iVar1 = SSL_read(ssl,auStack_78,0x40);
      if (iVar1 < 1) break;
      if (*(code **)((long)context + 8) == (code *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                    ,"decode_ssl_received_bytes",0x38a,1,"NULL on_bytes_received.");
        }
      }
      else {
        (**(code **)((long)context + 8))(*(undefined8 *)((long)context + 0x28),auStack_78,iVar1);
      }
    } while (0 < iVar1);
    if (ssl == (SSL *)0x0) {
      *(undefined4 *)((long)context + 0x68) = 6;
      indicate_error((TLS_IO_INSTANCE *)context);
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                  ,"on_underlying_io_bytes_received",0x3b1,1,"Error in decode_ssl_received_bytes.");
      }
    }
  }
  else if (*(int *)((long)context + 0x68) == 2) {
    send_handshake_bytes((TLS_IO_INSTANCE *)context);
    return;
  }
  return;
}

Assistant:

static void on_underlying_io_bytes_received(void* context, const unsigned char* buffer, size_t size)
{
    TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)context;

    int written = BIO_write(tls_io_instance->in_bio, buffer, (int)size);
    if (written != (int)size)
    {
        tls_io_instance->tlsio_state = TLSIO_STATE_ERROR;
        indicate_error(tls_io_instance);
        log_ERR_get_error("Error in BIO_write.");
    }
    else
    {
        switch (tls_io_instance->tlsio_state)
        {
        default:
            break;

        case TLSIO_STATE_IN_HANDSHAKE:
            send_handshake_bytes(tls_io_instance);
            break;

        case TLSIO_STATE_OPEN:
            if (decode_ssl_received_bytes(tls_io_instance) != 0)
            {
                tls_io_instance->tlsio_state = TLSIO_STATE_ERROR;
                indicate_error(tls_io_instance);
                LogError("Error in decode_ssl_received_bytes.");
            }
            break;
        }
    }
}